

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O1

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,string *h,int p)

{
  pointer pcVar1;
  long lVar2;
  network_error *this_00;
  string local_50;
  
  (this->sa).super_type.m_initialized = false;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  pcVar1 = (h->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host,pcVar1,pcVar1 + h->_M_string_length);
  this->port = p;
  lVar2 = std::__cxx11::string::find_first_of((char *)h,0x172637,0);
  if (lVar2 == -1) {
    return;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Hostname must not contain CR LF characters","");
  network_error::network_error(this_00,&local_50,false,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Inet_addr::Impl::Impl( const std::string& h, int p ):
  sa(), host(h), port(p)
{
  if (h.find_first_of("\n\r") != std::string::npos)
    throw network_error("Hostname must not contain CR LF characters", false);
}